

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
::Data(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_> *this,
      Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
      *other)

{
  Span *pSVar1;
  Entry *pEVar2;
  ulong uVar3;
  Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> *pNVar4;
  long lVar5;
  size_t sVar6;
  function<bool_(void_*,_void_*)> *__x;
  size_t sVar7;
  R_conflict9 RVar8;
  
  *(undefined4 *)this = 1;
  *(size_t *)(this + 8) = other->size;
  sVar6 = other->numBuckets;
  sVar7 = other->seed;
  *(size_t *)(this + 0x10) = other->numBuckets;
  *(size_t *)(this + 0x18) = sVar7;
  *(undefined8 *)(this + 0x20) = 0;
  RVar8 = allocateSpans(sVar6);
  *(Span **)(this + 0x20) = RVar8.spans;
  if (RVar8.nSpans != 0) {
    lVar5 = 0;
    sVar6 = 0;
    do {
      pSVar1 = other->spans;
      sVar7 = 0;
      do {
        uVar3 = (ulong)pSVar1->offsets[sVar7 + lVar5];
        if (uVar3 != 0xff) {
          pEVar2 = pSVar1[sVar6].entries;
          pNVar4 = Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
                   ::insert((Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
                             *)(*(long *)(this + 0x20) + sVar6 * 0x90),sVar7);
          __x = (function<bool_(void_*,_void_*)> *)(pEVar2[uVar3].storage.data + 8);
          pNVar4->key = (pair<int,_int>)__x[-1]._M_invoker;
          std::function<bool_(void_*,_void_*)>::function(&pNVar4->value,__x);
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 != 0x80);
      sVar6 = sVar6 + 1;
      lVar5 = lVar5 + 0x90;
    } while (sVar6 != RVar8.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }